

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d1_both.cc
# Opt level: O0

ssl_open_record_t __thiscall
bssl::dtls1_open_handshake
          (bssl *this,SSL *ssl,size_t *out_consumed,uint8_t *out_alert,Span<unsigned_char> in)

{
  Span<unsigned_char> in_00;
  bool bVar1;
  uint16_t uVar2;
  size_t sVar3;
  uchar *puVar4;
  size_t *psVar5;
  Span<const_unsigned_char> in_01;
  Span<const_unsigned_char> record_00;
  DTLSRecordNumber local_b0;
  uchar *local_a8;
  uint8_t *local_a0;
  Span<const_unsigned_char> local_98;
  DTLSRecordNumber local_88;
  int local_80 [2];
  uchar *local_78;
  uint8_t *local_70;
  uchar *local_68;
  ssl_open_record_t local_5c;
  undefined1 local_58 [4];
  ssl_open_record_t ret;
  Span<unsigned_char> record;
  DTLSRecordNumber record_number;
  uint8_t type;
  uint8_t *out_alert_local;
  size_t *out_consumed_local;
  SSL *ssl_local;
  Span<unsigned_char> in_local;
  
  DTLSRecordNumber::DTLSRecordNumber((DTLSRecordNumber *)&record.size_);
  Span<unsigned_char>::Span((Span<unsigned_char> *)local_58);
  in_00.size_ = (size_t)in.data_;
  in_00.data_ = out_alert;
  psVar5 = out_consumed;
  local_70 = out_alert;
  local_68 = in.data_;
  local_5c = dtls_open_record((SSL *)this,(uint8_t *)((long)&record_number.combined_ + 7),
                              (DTLSRecordNumber *)&record.size_,(Span<unsigned_char> *)local_58,
                              (size_t *)ssl,(uint8_t *)out_consumed,in_00);
  in_local.size_._4_4_ = local_5c;
  if (local_5c == ssl_open_record_success) {
    switch(record_number.combined_._7_1_) {
    case 0x14:
      sVar3 = Span<unsigned_char>::size((Span<unsigned_char> *)local_58);
      if ((sVar3 == 1) &&
         (puVar4 = Span<unsigned_char>::operator[]((Span<unsigned_char> *)local_58,0),
         *puVar4 == '\x01')) {
        uVar2 = DTLSRecordNumber::epoch((DTLSRecordNumber *)&record.size_);
        if (uVar2 == 0) {
          uVar2 = DTLSRecordNumber::epoch((DTLSRecordNumber *)&record.size_);
          if (uVar2 == *(uint16_t *)(*(long *)(this + 0x38) + 8)) {
            **(ushort **)(this + 0x38) = **(ushort **)(this + 0x38) & 0xfffe | 1;
            Span<unsigned_char_const>::
            Span<bssl::Span<unsigned_char>,void,bssl::Span<unsigned_char>>
                      ((Span<unsigned_char_const> *)local_80,(Span<unsigned_char> *)local_58);
            in_01.size_ = (size_t)psVar5;
            in_01.data_ = local_78;
            ssl_do_msg_callback(this,(SSL *)0x0,0x14,local_80[0],in_01);
            in_local.size_._4_4_ = ssl_open_record_success;
          }
          else {
            in_local.size_._4_4_ = ssl_open_record_discard;
          }
        }
        else {
          ERR_put_error(0x10,0,0xe1,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/d1_both.cc"
                        ,399);
          *(undefined1 *)out_consumed = 10;
          in_local.size_._4_4_ = ssl_open_record_error;
        }
      }
      else {
        ERR_put_error(0x10,0,0x67,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/d1_both.cc"
                      ,0x187);
        *(undefined1 *)out_consumed = 0x2f;
        in_local.size_._4_4_ = ssl_open_record_error;
      }
      break;
    default:
      ERR_put_error(0x10,0,0xe1,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/d1_both.cc"
                    ,0x1ab);
      *(undefined1 *)out_consumed = 10;
      in_local.size_._4_4_ = ssl_open_record_error;
      break;
    case 0x16:
      local_a0 = (uint8_t *)record.size_;
      Span<unsigned_char_const>::Span<bssl::Span<unsigned_char>,void,bssl::Span<unsigned_char>>
                ((Span<unsigned_char_const> *)&local_b0,(Span<unsigned_char> *)local_58);
      record_00.size_ = (size_t)psVar5;
      record_00.data_ = local_a8;
      bVar1 = dtls1_process_handshake_fragments
                        (this,(SSL *)out_consumed,local_a0,local_b0,record_00);
      if (bVar1) {
        in_local.size_._4_4_ = ssl_open_record_success;
      }
      else {
        in_local.size_._4_4_ = ssl_open_record_error;
      }
      break;
    case 0x17:
      in_local.size_._4_4_ = ssl_open_record_discard;
      break;
    case 0x1a:
      local_88.combined_ = record.size_;
      Span<unsigned_char_const>::Span<bssl::Span<unsigned_char>,void,bssl::Span<unsigned_char>>
                ((Span<unsigned_char_const> *)&local_98,(Span<unsigned_char> *)local_58);
      in_local.size_._4_4_ =
           dtls1_process_ack((SSL *)this,(uint8_t *)out_consumed,local_88,local_98);
    }
  }
  return in_local.size_._4_4_;
}

Assistant:

ssl_open_record_t dtls1_open_handshake(SSL *ssl, size_t *out_consumed,
                                       uint8_t *out_alert, Span<uint8_t> in) {
  uint8_t type;
  DTLSRecordNumber record_number;
  Span<uint8_t> record;
  auto ret = dtls_open_record(ssl, &type, &record_number, &record, out_consumed,
                              out_alert, in);
  if (ret != ssl_open_record_success) {
    return ret;
  }

  switch (type) {
    case SSL3_RT_APPLICATION_DATA:
      // In DTLS 1.2, out-of-order application data may be received between
      // ChangeCipherSpec and Finished. Discard it.
      return ssl_open_record_discard;

    case SSL3_RT_CHANGE_CIPHER_SPEC:
      if (record.size() != 1u || record[0] != SSL3_MT_CCS) {
        OPENSSL_PUT_ERROR(SSL, SSL_R_BAD_CHANGE_CIPHER_SPEC);
        *out_alert = SSL_AD_ILLEGAL_PARAMETER;
        return ssl_open_record_error;
      }

      // We do not support renegotiation, so encrypted ChangeCipherSpec records
      // are illegal.
      if (record_number.epoch() != 0) {
        OPENSSL_PUT_ERROR(SSL, SSL_R_UNEXPECTED_RECORD);
        *out_alert = SSL_AD_UNEXPECTED_MESSAGE;
        return ssl_open_record_error;
      }

      // Ignore ChangeCipherSpec from a previous epoch.
      if (record_number.epoch() != ssl->d1->read_epoch.epoch) {
        return ssl_open_record_discard;
      }

      // Flag the ChangeCipherSpec for later.
      // TODO(crbug.com/42290594): Should we reject this in DTLS 1.3?
      ssl->d1->has_change_cipher_spec = true;
      ssl_do_msg_callback(ssl, 0 /* read */, SSL3_RT_CHANGE_CIPHER_SPEC,
                          record);
      return ssl_open_record_success;

    case SSL3_RT_ACK:
      return dtls1_process_ack(ssl, out_alert, record_number, record);

    case SSL3_RT_HANDSHAKE:
      if (!dtls1_process_handshake_fragments(ssl, out_alert, record_number,
                                             record)) {
        return ssl_open_record_error;
      }
      return ssl_open_record_success;

    default:
      OPENSSL_PUT_ERROR(SSL, SSL_R_UNEXPECTED_RECORD);
      *out_alert = SSL_AD_UNEXPECTED_MESSAGE;
      return ssl_open_record_error;
  }
}